

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O1

void __thiscall ktx::CommandExtract::initOptions(CommandExtract *this,Options *opts)

{
  long lVar1;
  long *plVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [16];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
  ::init(&this->options,(EVP_PKEY_CTX *)opts);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"input-file","");
  std::__cxx11::string::string<std::allocator<char>>(local_58,OptionsExtract::kOutput,&local_79);
  options._M_len = 2;
  options._M_array = &local_78;
  cxxopts::Options::parse_positional(opts,options);
  lVar1 = -0x40;
  plVar2 = local_48;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"<input-file> <output>","");
  std::__cxx11::string::operator=((string *)&opts->m_positional_help,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void CommandExtract::initOptions(cxxopts::Options& opts) {
    options.init(opts);
    opts.parse_positional({"input-file", OptionsExtract::kOutput});
    opts.positional_help("<input-file> <output>");
}